

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O3

void __thiscall QWidgetWindow::handleExposeEvent(QWidgetWindow *this,QExposeEvent *event)

{
  QWidgetPrivate *this_00;
  Data *pDVar1;
  QWidget *this_01;
  bool bVar2;
  char cVar3;
  long lVar4;
  QObject *pQVar5;
  long in_FS_OFFSET;
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QWidget::testAttribute_helper((QWidget *)(this->m_widget).wp.value,WA_DontShowOnScreen);
  if (!bVar2) {
    this_00 = *(QWidgetPrivate **)((this->m_widget).wp.value + 8);
    cVar3 = QWindow::isExposed();
    if (cVar3 == '\0') {
      if ((~*(uint *)&this_00->field_0x250 & 0x60000000) == 0) {
        QWidgetPrivate::hideChildren(this_00,true);
        local_38 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
        QHideEvent::QHideEvent((QHideEvent *)&local_38);
        pDVar1 = (this->m_widget).wp.d;
        if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
          pQVar5 = (QObject *)0x0;
        }
        else {
          pQVar5 = (this->m_widget).wp.value;
        }
        QCoreApplication::forwardEvent(pQVar5,(QEvent *)&local_38,(QEvent *)event);
        this_00->field_0x253 = this_00->field_0x253 & 0xbf;
        QHideEvent::~QHideEvent((QHideEvent *)&local_38);
      }
      QWidget::setAttribute((QWidget *)(this->m_widget).wp.value,WA_Mapped,false);
    }
    else if (((this_00->data).field_0x12 & 4) == 0) {
      if ((*(uint *)&this_00->field_0x250 & 0x60000000) == 0x20000000) {
        QWidgetPrivate::showChildren(this_00,true);
        local_38 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
        QShowEvent::QShowEvent((QShowEvent *)&local_38);
        pDVar1 = (this->m_widget).wp.d;
        if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
          pQVar5 = (QObject *)0x0;
        }
        else {
          pQVar5 = (this->m_widget).wp.value;
        }
        QCoreApplication::forwardEvent(pQVar5,(QEvent *)&local_38,(QEvent *)event);
        this_00->field_0x253 = this_00->field_0x253 | 0x40;
        QShowEvent::~QShowEvent((QShowEvent *)&local_38);
      }
      QWidget::setAttribute((QWidget *)(this->m_widget).wp.value,WA_Mapped,true);
      lVar4 = *(long *)((this->m_widget).wp.value + 8);
      while ((this_01 = *(QWidget **)(lVar4 + 0x10), this_01 != (QWidget *)0x0 &&
             ((this_01->data->widget_attributes & 0x800) == 0))) {
        QWidget::setAttribute(this_01,WA_Mapped,true);
        lVar4 = *(long *)&this_01->field_0x8;
      }
      cVar3 = QRegion::isNull();
      if (cVar3 == '\0') {
        QWidgetPrivate::syncBackingStore(this_00,(QRegion *)(event + 0x10));
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetWindow::handleExposeEvent(QExposeEvent *event)
{
    if (m_widget->testAttribute(Qt::WA_DontShowOnScreen))
        return; // Ignore for widgets that fake exposure

    QWidgetPrivate *wPriv = m_widget->d_func();
    const bool exposed = isExposed();

    // We might get an expose event from the platform as part of
    // closing the window from ~QWidget, to support animated close
    // transitions. But at that point we no longer have a widget
    // subclass to draw a new frame, so skip the expose event.
    if (exposed && wPriv->data.in_destructor)
        return;

    if (wPriv->childrenHiddenByWState) {
        // If widgets has been previously hidden by window state change event
        // and they aren't yet shown...
        if (exposed) {
            // If the window becomes exposed...
            if (!wPriv->childrenShownByExpose) {
                // ... and they haven't been shown by this function yet - show it.
                wPriv->showChildren(true);
                QShowEvent showEvent;
                QCoreApplication::forwardEvent(m_widget, &showEvent, event);
                wPriv->childrenShownByExpose = true;
            }
        } else {
            // If the window becomes not exposed...
            if (wPriv->childrenShownByExpose) {
                // ... and child widgets was previously shown by the expose event - hide widgets again.
                // This is a workaround, because sometimes when window is minimized programmatically,
                // the QPA can notify that the window is exposed after changing window state to minimized
                // and then, the QPA can send next expose event with null exposed region (not exposed).
                wPriv->hideChildren(true);
                QHideEvent hideEvent;
                QCoreApplication::forwardEvent(m_widget, &hideEvent, event);
                wPriv->childrenShownByExpose = false;
            }
        }
    }

    if (exposed) {
        // QTBUG-39220, QTBUG-58575: set all (potentially fully obscured parent widgets) mapped.
        m_widget->setAttribute(Qt::WA_Mapped);
        for (QWidget *p = m_widget->parentWidget(); p && !p->testAttribute(Qt::WA_Mapped); p = p->parentWidget())
            p->setAttribute(Qt::WA_Mapped);
        if (!event->m_region.isNull())
            wPriv->syncBackingStore(event->m_region);
    } else {
        m_widget->setAttribute(Qt::WA_Mapped, false);
    }
}